

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::PrimitiveTypeName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Options *options,CppType type)

{
  LogMessage *pLVar1;
  char *in_R8;
  string_view type_00;
  string_view type_01;
  string_view type_02;
  string_view type_03;
  LogMessageFatal local_90 [22];
  Voidify local_7a;
  allocator<char> local_79;
  allocator<char> local_78;
  allocator<char> local_77;
  allocator<char> local_76;
  allocator<char> local_75 [20];
  allocator<char> local_61;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  undefined4 local_1c;
  cpp *pcStack_18;
  CppType type_local;
  Options *options_local;
  
  local_1c = SUB84(options,0);
  pcStack_18 = this;
  options_local = (Options *)__return_storage_ptr__;
  switch(local_1c) {
  case 1:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,"int32");
    type_00._M_str = in_R8;
    type_00._M_len = (size_t)local_30._M_str;
    (anonymous_namespace)::IntTypeName_abi_cxx11_
              (__return_storage_ptr__,(_anonymous_namespace_ *)this,(Options *)local_30._M_len,
               type_00);
    break;
  case 2:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,"int64");
    type_01._M_str = in_R8;
    type_01._M_len = (size_t)local_40._M_str;
    (anonymous_namespace)::IntTypeName_abi_cxx11_
              (__return_storage_ptr__,(_anonymous_namespace_ *)this,(Options *)local_40._M_len,
               type_01);
    break;
  case 3:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,"uint32");
    type_02._M_str = in_R8;
    type_02._M_len = (size_t)local_50._M_str;
    (anonymous_namespace)::IntTypeName_abi_cxx11_
              (__return_storage_ptr__,(_anonymous_namespace_ *)this,(Options *)local_50._M_len,
               type_02);
    break;
  case 4:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,"uint64");
    type_03._M_str = in_R8;
    type_03._M_len = (size_t)local_60._M_str;
    (anonymous_namespace)::IntTypeName_abi_cxx11_
              (__return_storage_ptr__,(_anonymous_namespace_ *)this,(Options *)local_60._M_len,
               type_03);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"double",&local_61);
    std::allocator<char>::~allocator(&local_61);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"float",local_75);
    std::allocator<char>::~allocator(local_75);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"bool",&local_76);
    std::allocator<char>::~allocator(&local_76);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"int",&local_77);
    std::allocator<char>::~allocator(&local_77);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"std::string",&local_78);
    std::allocator<char>::~allocator(&local_78);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_79);
    std::allocator<char>::~allocator(&local_79);
    break;
  default:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/cpp/helpers.cc"
               ,0x2e0);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_90);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       (pLVar1,(char (*) [16])"Can\'t get here.");
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_7a,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PrimitiveTypeName(const Options& options,
                              FieldDescriptor::CppType type) {
  switch (type) {
    case FieldDescriptor::CPPTYPE_INT32:
      return IntTypeName(options, "int32");
    case FieldDescriptor::CPPTYPE_INT64:
      return IntTypeName(options, "int64");
    case FieldDescriptor::CPPTYPE_UINT32:
      return IntTypeName(options, "uint32");
    case FieldDescriptor::CPPTYPE_UINT64:
      return IntTypeName(options, "uint64");
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return "double";
    case FieldDescriptor::CPPTYPE_FLOAT:
      return "float";
    case FieldDescriptor::CPPTYPE_BOOL:
      return "bool";
    case FieldDescriptor::CPPTYPE_ENUM:
      return "int";
    case FieldDescriptor::CPPTYPE_STRING:
      return "std::string";
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "";

      // No default because we want the compiler to complain if any new
      // CppTypes are added.
  }

  ABSL_LOG(FATAL) << "Can't get here.";
  return "";
}